

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
deqp::gls::LifetimeTests::details::createLifeTestGroup
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,LifeTestSpec *spec,
          vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
          *types)

{
  Type *type;
  int iVar1;
  int iVar2;
  TestNode *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LifeTest *this_00;
  pointer ppTVar3;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,spec->name,spec->name);
  (__return_storage_ptr__->
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data.ptr =
       (TestCaseGroup *)this;
  ppTVar3 = (types->
            super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppTVar3 ==
        (types->
        super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    type = *ppTVar3;
    iVar1 = (*type->_vptr_Type[7])(type);
    if (spec->needBind == true) {
      iVar2 = (*type->_vptr_Type[6])(type);
      if (CONCAT44(extraout_var_00,iVar2) != 0) goto LAB_014b703c;
    }
    else {
LAB_014b703c:
      this_00 = (LifeTest *)operator_new(0xc0);
      LifeTest::LifeTest(this_00,(char *)CONCAT44(extraout_var,iVar1),
                         (char *)CONCAT44(extraout_var,iVar1),type,spec->func);
      tcu::TestNode::addChild(this,(TestNode *)this_00);
    }
    ppTVar3 = ppTVar3 + 1;
  } while( true );
}

Assistant:

MovePtr<TestCaseGroup> createLifeTestGroup (TestContext& testCtx,
											const LifeTestSpec& spec,
											const vector<Type*>& types)
{
	MovePtr<TestCaseGroup> group(new TestCaseGroup(testCtx, spec.name, spec.name));

	for (vector<Type*>::const_iterator it = types.begin(); it != types.end(); ++it)
	{
		Type& type = **it;
		const char* name = type.getName();
		if (!spec.needBind || type.binder() != DE_NULL)
			group->addChild(new LifeTest(name, name, type, spec.func));
	}

	return group;
}